

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubString.cpp
# Opt level: O0

char16 * __thiscall Js::SubString::GetSz(SubString *this)

{
  charcount_t length;
  void **ppvVar1;
  ScriptContext *this_00;
  Recycler *recycler_00;
  char16 *pcVar2;
  nullptr_t local_28;
  char16 *local_20;
  char16 *newInstance;
  Recycler *recycler;
  SubString *this_local;
  
  recycler = (Recycler *)this;
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&this->originalFullStringReference);
  if (*ppvVar1 != (void *)0x0) {
    this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    recycler_00 = ScriptContext::GetRecycler(this_00);
    newInstance = (char16 *)recycler_00;
    pcVar2 = JavascriptString::UnsafeGetBuffer(&this->super_JavascriptString);
    length = JavascriptString::GetLength(&this->super_JavascriptString);
    local_20 = JavascriptString::AllocateLeafAndCopySz(recycler_00,pcVar2,length);
    JavascriptString::SetBuffer(&this->super_JavascriptString,local_20);
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<const_void>::operator=(&this->originalFullStringReference,&local_28);
  }
  pcVar2 = JavascriptString::UnsafeGetBuffer(&this->super_JavascriptString);
  return pcVar2;
}

Assistant:

const char16* SubString::GetSz()
    {
        if (originalFullStringReference)
        {
            Recycler* recycler = this->GetScriptContext()->GetRecycler();
            char16 * newInstance = AllocateLeafAndCopySz(recycler, UnsafeGetBuffer(), GetLength());
            this->SetBuffer(newInstance);

            // We don't need the string reference anymore, set it to nullptr and use this to know our string is nullptr terminated
            originalFullStringReference = nullptr;
        }

        return UnsafeGetBuffer();
    }